

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaComponentListFree(xmlSchemaItemListPtr list)

{
  xmlSchemaTypeType type;
  void **ppvVar1;
  xmlSchemaTypePtr type_00;
  xmlSchemaAttributePtr_conflict pxVar2;
  _xmlSchemaAnnot *p_Var3;
  _xmlSchemaType *p_Var4;
  xmlPatternPtr comp;
  xmlSchemaTypePtr pxVar5;
  xmlSchemaTypePtr pxVar6;
  char *extra;
  long lVar7;
  xmlSchemaAnnotPtr pxVar8;
  _xmlSchemaType *p_Var9;
  xmlSchemaAttributePtr_conflict pxVar10;
  
  if (list->nbItems != 0) {
    if (0 < list->nbItems) {
      ppvVar1 = list->items;
      lVar7 = 0;
      do {
        type_00 = (xmlSchemaTypePtr)ppvVar1[lVar7];
        if (type_00 == (xmlSchemaTypePtr)0x0) goto LAB_001b8445;
        type = type_00->type;
        switch(type) {
        case XML_SCHEMA_TYPE_BASIC:
          extra = "simple type definition";
          if (type_00->builtInType == 0x2d) {
            extra = "complex type definition";
          }
          goto LAB_001b82f3;
        case XML_SCHEMA_TYPE_ANY:
        case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
          xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)type_00);
          goto LAB_001b8445;
        case XML_SCHEMA_TYPE_FACET:
        case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
        case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
        case XML_SCHEMA_TYPE_UR:
        case XML_SCHEMA_TYPE_RESTRICTION:
        case XML_SCHEMA_TYPE_EXTENSION:
        case XML_SCHEMA_TYPE_LIST:
        case XML_SCHEMA_TYPE_UNION:
          goto switchD_001b81c6_caseD_3;
        case XML_SCHEMA_TYPE_SIMPLE:
        case XML_SCHEMA_TYPE_COMPLEX:
          xmlSchemaFreeType(type_00);
          goto LAB_001b8445;
        case XML_SCHEMA_TYPE_SEQUENCE:
        case XML_SCHEMA_TYPE_CHOICE:
        case XML_SCHEMA_TYPE_ALL:
          p_Var9 = type_00->next;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(long *)p_Var9 == 0) goto LAB_001b840c;
            do {
              p_Var4 = *(_xmlSchemaType **)p_Var9;
              (*xmlFree)(p_Var9);
              p_Var9 = p_Var4;
            } while (p_Var4 != (_xmlSchemaType *)0x0);
          }
          break;
        case XML_SCHEMA_TYPE_ELEMENT:
          pxVar8 = type_00->annot;
          if (pxVar8 != (xmlSchemaAnnotPtr)0x0) {
            if (pxVar8->next == (_xmlSchemaAnnot *)0x0) {
              (*xmlFree)(pxVar8);
            }
            else {
              do {
                p_Var3 = pxVar8->next;
                (*xmlFree)(pxVar8);
                pxVar8 = p_Var3;
              } while (p_Var3 != (_xmlSchemaAnnot *)0x0);
            }
          }
          if (*(xmlRegexpPtr *)&type_00->builtInType != (xmlRegexpPtr)0x0) {
            xmlRegFreeRegexp(*(xmlRegexpPtr *)&type_00->builtInType);
          }
          pxVar10 = (xmlSchemaAttributePtr_conflict)type_00->refPrefix;
          goto LAB_001b8435;
        case XML_SCHEMA_TYPE_ATTRIBUTE:
          pxVar10 = type_00->attributes;
          if (pxVar10 != (xmlSchemaAttributePtr_conflict)0x0) {
            if (*(long *)pxVar10 == 0) {
              (*xmlFree)(pxVar10);
            }
            else {
              do {
                pxVar2 = *(xmlSchemaAttributePtr_conflict *)pxVar10;
                (*xmlFree)(pxVar10);
                pxVar10 = pxVar2;
              } while (pxVar2 != (xmlSchemaAttributePtr_conflict)0x0);
            }
          }
          pxVar10 = *(xmlSchemaAttributePtr_conflict *)&type_00->recurse;
          goto LAB_001b8435;
        case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
          pxVar8 = type_00->annot;
          if (pxVar8 != (xmlSchemaAnnotPtr)0x0) {
            if (pxVar8->next == (_xmlSchemaAnnot *)0x0) {
              (*xmlFree)(pxVar8);
            }
            else {
              do {
                p_Var3 = pxVar8->next;
                (*xmlFree)(pxVar8);
                pxVar8 = p_Var3;
              } while (p_Var3 != (_xmlSchemaAnnot *)0x0);
            }
          }
          p_Var9 = type_00->baseType;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(void **)p_Var9 != (void *)0x0) {
              (*xmlFree)(*(void **)p_Var9);
            }
LAB_001b840c:
            (*xmlFree)(p_Var9);
          }
          break;
        case XML_SCHEMA_TYPE_GROUP:
          p_Var9 = type_00->next;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(long *)p_Var9 == 0) goto LAB_001b840c;
            do {
              p_Var4 = *(_xmlSchemaType **)p_Var9;
              (*xmlFree)(p_Var9);
              p_Var9 = p_Var4;
            } while (p_Var4 != (_xmlSchemaType *)0x0);
          }
          break;
        case XML_SCHEMA_TYPE_NOTATION:
          break;
        case XML_SCHEMA_TYPE_IDC_UNIQUE:
        case XML_SCHEMA_TYPE_IDC_KEY:
        case XML_SCHEMA_TYPE_IDC_KEYREF:
          p_Var9 = type_00->next;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(long *)p_Var9 == 0) {
              (*xmlFree)(p_Var9);
            }
            else {
              do {
                p_Var4 = *(_xmlSchemaType **)p_Var9;
                (*xmlFree)(p_Var9);
                p_Var9 = p_Var4;
              } while (p_Var4 != (_xmlSchemaType *)0x0);
            }
          }
          if (type_00->annot != (xmlSchemaAnnotPtr)0x0) {
            comp = (xmlPatternPtr)type_00->annot[2].next;
            if (comp != (xmlPatternPtr)0x0) {
              xmlFreePattern(comp);
            }
            (*xmlFree)(type_00->annot);
          }
          pxVar6 = type_00->subtypes;
          while (pxVar6 != (xmlSchemaTypePtr)0x0) {
            pxVar5 = *(xmlSchemaTypePtr *)pxVar6;
            if ((xmlPatternPtr)pxVar6->ref != (xmlPatternPtr)0x0) {
              xmlFreePattern((xmlPatternPtr)pxVar6->ref);
            }
            (*xmlFree)(pxVar6);
            pxVar6 = pxVar5;
          }
          (*xmlFree)(type_00);
          goto LAB_001b8445;
        case XML_SCHEMA_TYPE_PARTICLE:
          p_Var9 = type_00->next;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(long *)p_Var9 == 0) goto LAB_001b840c;
            do {
              p_Var4 = *(_xmlSchemaType **)p_Var9;
              (*xmlFree)(p_Var9);
              p_Var9 = p_Var4;
            } while (p_Var4 != (_xmlSchemaType *)0x0);
          }
          break;
        case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
          p_Var9 = type_00->next;
          if (p_Var9 != (_xmlSchemaType *)0x0) {
            if (*(long *)p_Var9 == 0) {
              (*xmlFree)(p_Var9);
            }
            else {
              do {
                p_Var4 = *(_xmlSchemaType **)p_Var9;
                (*xmlFree)(p_Var9);
                p_Var9 = p_Var4;
              } while (p_Var4 != (_xmlSchemaType *)0x0);
            }
          }
          pxVar10 = type_00->attributes;
LAB_001b8435:
          if (pxVar10 != (xmlSchemaAttributePtr_conflict)0x0) {
            xmlSchemaFreeValue((xmlSchemaValPtr)pxVar10);
          }
          break;
        default:
          if ((type == XML_SCHEMA_EXTRA_QNAMEREF) || (type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB))
          break;
          goto switchD_001b81c6_caseD_3;
        }
        (*xmlFree)(type_00);
LAB_001b8445:
        lVar7 = lVar7 + 1;
      } while (lVar7 < list->nbItems);
    }
    list->nbItems = 0;
  }
  return;
switchD_001b81c6_caseD_3:
  extra = (char *)xmlSchemaItemTypeToStr(type);
LAB_001b82f3:
  __xmlSimpleError(0x10,0xbfd,(xmlNodePtr)0x0,
                   "Internal error: xmlSchemaComponentListFree, unexpected component type \'%s\'\n",
                   extra);
  goto LAB_001b8445;
}

Assistant:

static void
xmlSchemaComponentListFree(xmlSchemaItemListPtr list)
{
    if ((list == NULL) || (list->nbItems == 0))
	return;
    {
	xmlSchemaTreeItemPtr item;
	xmlSchemaTreeItemPtr *items = (xmlSchemaTreeItemPtr *) list->items;
	int i;

	for (i = 0; i < list->nbItems; i++) {
	    item = items[i];
	    if (item == NULL)
		continue;
	    switch (item->type) {
		case XML_SCHEMA_TYPE_SIMPLE:
		case XML_SCHEMA_TYPE_COMPLEX:
		    xmlSchemaFreeType((xmlSchemaTypePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE:
		    xmlSchemaFreeAttribute((xmlSchemaAttributePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
		    xmlSchemaFreeAttributeUse((xmlSchemaAttributeUsePtr) item);
		    break;
		case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
		    xmlSchemaFreeAttributeUseProhib(
			(xmlSchemaAttributeUseProhibPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ELEMENT:
		    xmlSchemaFreeElement((xmlSchemaElementPtr) item);
		    break;
		case XML_SCHEMA_TYPE_PARTICLE:
		    if (item->annot != NULL)
			xmlSchemaFreeAnnot(item->annot);
		    xmlFree(item);
		    break;
		case XML_SCHEMA_TYPE_SEQUENCE:
		case XML_SCHEMA_TYPE_CHOICE:
		case XML_SCHEMA_TYPE_ALL:
		    xmlSchemaFreeModelGroup((xmlSchemaModelGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    xmlSchemaFreeAttributeGroup(
			(xmlSchemaAttributeGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    xmlSchemaFreeModelGroupDef(
			(xmlSchemaModelGroupDefPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ANY:
		case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
		    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr) item);
		    break;
		case XML_SCHEMA_TYPE_IDC_KEY:
		case XML_SCHEMA_TYPE_IDC_UNIQUE:
		case XML_SCHEMA_TYPE_IDC_KEYREF:
		    xmlSchemaFreeIDC((xmlSchemaIDCPtr) item);
		    break;
		case XML_SCHEMA_TYPE_NOTATION:
		    xmlSchemaFreeNotation((xmlSchemaNotationPtr) item);
		    break;
		case XML_SCHEMA_EXTRA_QNAMEREF:
		    xmlSchemaFreeQNameRef((xmlSchemaQNameRefPtr) item);
		    break;
		default: {
		    /* TODO: This should never be hit. */
		    xmlSchemaPSimpleInternalErr(NULL,
			"Internal error: xmlSchemaComponentListFree, "
			"unexpected component type '%s'\n",
			(const xmlChar *) WXS_ITEM_TYPE_NAME(item));
			 }
		    break;
	    }
	}
	list->nbItems = 0;
    }
}